

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

int __thiscall CPU::instrLSR0x46(CPU *this)

{
  uint16_t addr;
  Memory *this_00;
  byte bVar1;
  byte bVar2;
  
  addr = this->PC;
  this->PC = addr + 1;
  bVar1 = Memory::Read8(this->m,addr);
  this_00 = this->m;
  bVar2 = Memory::Read8(this_00,(ushort)bVar1);
  this->field_0x2e = bVar2 << 7 | (bVar2 < 2) << 6 | this->field_0x2e & 0x3e;
  Memory::Write8(this_00,(ushort)bVar1,bVar2 >> 1);
  return 5;
}

Assistant:

int CPU::instrLSR0x46() {
	uint16_t address = zeropage_addr_j();
	m->Write8(address, LSR(m->Read8(address)));
	return 5;
}